

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

int do_cmake(int ac,char **av)

{
  char **str1;
  char cVar1;
  bool bVar2;
  cmState *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool noconfigure;
  int iVar7;
  uint uVar8;
  CacheEntryType type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar9;
  char *pcVar10;
  bool in_DL;
  undefined4 in_register_0000003c;
  int iVar11;
  int iVar12;
  pointer key;
  allocator local_419;
  string local_418;
  char **local_3f8;
  WorkingMode local_3ec;
  ulong local_3e8;
  undefined8 local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  cmake cm;
  
  local_3e0 = CONCAT44(in_register_0000003c,ac);
  local_3f8 = av;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_((string *)&cm,(SystemTools *)0x1,in_DL);
  std::__cxx11::string::~string((string *)&cm);
  if (cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "Current working directory cannot be established.");
    std::endl<char,std::char_traits<char>>(poVar9);
    uVar8 = 1;
  }
  else {
    cmDocumentation::cmDocumentation(&doc);
    cmDocumentation::addCMakeStandardDocSections(&doc);
    bVar4 = cmDocumentation::CheckOptions(&doc,(int)local_3e0,local_3f8,(char *)0x0);
    if (bVar4) {
      cmake::cmake(&cm);
      std::__cxx11::string::string((string *)&local_418,"",(allocator *)&args);
      cmake::SetHomeDirectory(&cm,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::string((string *)&local_418,"",(allocator *)&args);
      cmake::SetHomeOutputDirectory(&cm,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      cmake::AddCMakePaths(&cm);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                 local_3f8,local_3f8 + (int)local_3e0,(allocator_type *)&local_418);
      cmake::SetCacheArgs(&cm,&args);
      generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmake::GetGeneratorDocumentation(&cm,&generators);
      std::__cxx11::string::string((string *)&local_418,"cmake",&local_419);
      cmDocumentation::SetName(&doc,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      cmDocumentation::SetSection(&doc,"Name",cmDocumentationName);
      cmDocumentation::SetSection(&doc,"Usage",cmDocumentationUsage);
      if ((int)local_3e0 == 1) {
        cmDocumentation::AppendSection(&doc,"Usage",cmDocumentationUsageNote);
      }
      cmDocumentation::AppendSection(&doc,"Generators",&generators);
      cmDocumentation::PrependSection(&doc,"Options",cmDocumentationOptions);
      bVar4 = cmDocumentation::PrintRequestedDocumentation(&doc,(ostream *)&std::cout);
      uVar8 = (uint)!bVar4;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&generators)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      cmake::~cmake(&cm);
    }
    else {
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar11 = (int)local_3e0 + -1;
      bVar4 = false;
      bVar6 = false;
      local_3e8 = 0;
      bVar2 = false;
      noconfigure = false;
      local_3ec = NORMAL_MODE;
      for (iVar12 = 0; iVar12 < (int)local_3e0; iVar12 = iVar12 + 1) {
        pcVar10 = local_3f8[iVar12];
        cVar1 = *pcVar10;
        if (((cVar1 == '-') && (pcVar10[1] == 'i')) && (pcVar10[2] == '\0')) {
          std::operator<<((ostream *)&std::cerr,
                          "The \"cmake -i\" wizard mode is no longer supported.\nUse the -D option to set cache values on the command line.\nUse cmake-gui or ccmake for an interactive dialog.\n"
                         );
          uVar8 = 1;
          goto LAB_002650ba;
        }
        iVar7 = strcmp(pcVar10,"--system-information");
        if (iVar7 == 0) {
          bVar4 = true;
        }
        else if (cVar1 == '-') {
          if ((pcVar10[1] == 'N') && (pcVar10[2] == '\0')) {
            noconfigure = true;
          }
          else {
            if ((pcVar10[1] != 'L') || (pcVar10[2] != '\0')) goto LAB_00264bed;
            bVar6 = true;
          }
        }
        else {
LAB_00264bed:
          iVar7 = strcmp(pcVar10,"-LA");
          if (iVar7 == 0) {
            local_3e8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar7) >> 8),1);
          }
          else {
            iVar7 = strcmp(pcVar10,"-LH");
            if (iVar7 == 0) {
              bVar6 = true;
            }
            else {
              iVar7 = strcmp(pcVar10,"-LAH");
              if (iVar7 != 0) {
                str1 = local_3f8 + iVar12;
                bVar5 = cmHasLiteralPrefix<char_const*,3ul>(str1,(char (*) [3])0x476141);
                if (bVar5) {
                  if (iVar12 == iVar11) {
                    cmSystemTools::Error
                              ("No script specified for argument -P",(char *)0x0,(char *)0x0,
                               (char *)0x0);
                    iVar12 = iVar11;
                  }
                  else {
                    std::__cxx11::string::string((string *)&cm,*str1,(allocator *)&local_418);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&cm);
                    std::__cxx11::string::~string((string *)&cm);
                    std::__cxx11::string::string
                              ((string *)&cm,local_3f8[(long)iVar12 + 1],(allocator *)&local_418);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&cm);
                    iVar12 = iVar12 + 1;
                    std::__cxx11::string::~string((string *)&cm);
                    local_3ec = SCRIPT_MODE;
                  }
                }
                else {
                  bVar5 = cmHasLiteralPrefix<char_const*,15ul>(str1,(char (*) [15])"--find-package")
                  ;
                  if (bVar5) {
                    std::__cxx11::string::string((string *)&cm,*str1,(allocator *)&local_418);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&cm);
                    std::__cxx11::string::~string((string *)&cm);
                    local_3ec = FIND_PACKAGE_MODE;
                  }
                  else {
                    std::__cxx11::string::string((string *)&cm,*str1,(allocator *)&local_418);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&cm);
                    std::__cxx11::string::~string((string *)&cm);
                  }
                }
                goto LAB_00264d82;
              }
              local_3e8 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar7) >> 8),1);
            }
            bVar2 = true;
          }
        }
LAB_00264d82:
      }
      if (bVar4) {
        cmake::cmake(&cm);
        std::__cxx11::string::string((string *)&local_418,"",(allocator *)&generators);
        cmake::SetHomeDirectory(&cm,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::string((string *)&local_418,"",(allocator *)&generators);
        cmake::SetHomeOutputDirectory(&cm,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        uVar8 = cmake::GetSystemInformation(&cm,&args);
      }
      else {
        cmake::cmake(&cm);
        std::__cxx11::string::string((string *)&local_418,"",(allocator *)&generators);
        cmake::SetHomeDirectory(&cm,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::string((string *)&local_418,"",(allocator *)&generators);
        cmake::SetHomeOutputDirectory(&cm,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        cmSystemTools::SetMessageCallback(cmakemainMessageCallback,&cm);
        cmake::SetProgressCallback(&cm,cmakemainProgressCallback,&cm);
        cm.CurrentWorkingMode = local_3ec;
        iVar12 = cmake::Run(&cm,&args,noconfigure);
        if ((bVar6) || ((local_3e8 & 1) != 0)) {
          poVar9 = std::operator<<((ostream *)&std::cout,"-- Cache values");
          std::endl<char,std::char_traits<char>>(poVar9);
          local_3f8 = (char **)CONCAT44(local_3f8._4_4_,iVar12);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&generators,cm.State);
          local_3e8 = local_3e8 ^ 1;
          for (key = generators.
                     super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              key != generators.
                     super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish; key = (pointer)&key->Brief) {
            type = cmState::GetCacheEntryType(cm.State,&key->Name);
            pcVar3 = cm.State;
            if (type + ~UNINITIALIZED < 0xfffffffd) {
              std::__cxx11::string::string((string *)&local_418,"ADVANCED",&local_419);
              pcVar10 = cmState::GetCacheEntryProperty(pcVar3,&key->Name,&local_418);
              std::__cxx11::string::~string((string *)&local_418);
              if (((byte)local_3e8 & pcVar10 != (char *)0x0) == 0) {
                if (bVar2) {
                  poVar9 = std::operator<<((ostream *)&std::cout,"// ");
                  pcVar3 = cm.State;
                  std::__cxx11::string::string((string *)&local_418,"HELPSTRING",&local_419);
                  pcVar10 = cmState::GetCacheEntryProperty(pcVar3,&key->Name,&local_418);
                  poVar9 = std::operator<<(poVar9,pcVar10);
                  std::endl<char,std::char_traits<char>>(poVar9);
                  std::__cxx11::string::~string((string *)&local_418);
                }
                poVar9 = std::operator<<((ostream *)&std::cout,(string *)key);
                poVar9 = std::operator<<(poVar9,":");
                pcVar10 = cmState::CacheEntryTypeToString(type);
                poVar9 = std::operator<<(poVar9,pcVar10);
                poVar9 = std::operator<<(poVar9,"=");
                pcVar10 = cmState::GetCacheEntryValue(cm.State,&key->Name);
                poVar9 = std::operator<<(poVar9,pcVar10);
                std::endl<char,std::char_traits<char>>(poVar9);
                if (bVar2) {
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                }
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&generators);
          iVar12 = (int)local_3f8;
        }
        uVar8 = (uint)(iVar12 != 0);
      }
      cmake::~cmake(&cm);
LAB_002650ba:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
    }
    cmDocumentation::~cmDocumentation(&doc);
  }
  return uVar8;
}

Assistant:

int do_cmake(int ac, char const* const* av)
{
  if (cmSystemTools::GetCurrentWorkingDirectory().empty())
    {
    std::cerr << "Current working directory cannot be established."
              << std::endl;
    return 1;
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(ac, av))
    {
    // Construct and print requested documentation.
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();

    // the command line args are processed here so that you can do
    // -DCMAKE_MODULE_PATH=/some/path and have this value accessible here
    std::vector<std::string> args(av, av + ac);
    hcm.SetCacheArgs(args);

    std::vector<cmDocumentationEntry> generators;

    hcm.GetGeneratorDocumentation(generators);

    doc.SetName("cmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( ac == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.AppendSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);

    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }
#else
  if ( ac == 1 )
    {
    std::cout <<
      "Bootstrap CMake should not be used outside CMake build process."
              << std::endl;
    return 0;
    }
#endif

  bool sysinfo = false;
  bool list_cached = false;
  bool list_all_cached = false;
  bool list_help = false;
  bool view_only = false;
  cmake::WorkingMode workingMode = cmake::NORMAL_MODE;
  std::vector<std::string> args;
  for(int i =0; i < ac; ++i)
    {
    if(strcmp(av[i], "-i") == 0)
      {
      std::cerr <<
        "The \"cmake -i\" wizard mode is no longer supported.\n"
        "Use the -D option to set cache values on the command line.\n"
        "Use cmake-gui or ccmake for an interactive dialog.\n";
      return 1;
      }
    else if(strcmp(av[i], "--system-information") == 0)
      {
      sysinfo = true;
      }
    else if (strcmp(av[i], "-N") == 0)
      {
      view_only = true;
      }
    else if (strcmp(av[i], "-L") == 0)
      {
      list_cached = true;
      }
    else if (strcmp(av[i], "-LA") == 0)
      {
      list_all_cached = true;
      }
    else if (strcmp(av[i], "-LH") == 0)
      {
      list_cached = true;
      list_help = true;
      }
    else if (strcmp(av[i], "-LAH") == 0)
      {
      list_all_cached = true;
      list_help = true;
      }
    else if (cmHasLiteralPrefix(av[i], "-P"))
      {
      if ( i == ac -1 )
        {
        cmSystemTools::Error("No script specified for argument -P");
        }
      else
        {
        workingMode = cmake::SCRIPT_MODE;
        args.push_back(av[i]);
        i++;
        args.push_back(av[i]);
        }
      }
    else if (cmHasLiteralPrefix(av[i], "--find-package"))
      {
      workingMode = cmake::FIND_PACKAGE_MODE;
      args.push_back(av[i]);
      }
    else
      {
      args.push_back(av[i]);
      }
    }
  if (sysinfo)
    {
    cmake cm;
    cm.SetHomeDirectory("");
    cm.SetHomeOutputDirectory("");
    int ret = cm.GetSystemInformation(args);
    return ret;
    }
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmSystemTools::SetMessageCallback(cmakemainMessageCallback, (void *)&cm);
  cm.SetProgressCallback(cmakemainProgressCallback, (void *)&cm);
  cm.SetWorkingMode(workingMode);

  int res = cm.Run(args, view_only);
  if ( list_cached || list_all_cached )
    {
    std::cout << "-- Cache values" << std::endl;
    std::vector<std::string> keys = cm.GetState()->GetCacheEntryKeys();
    for (std::vector<std::string>::const_iterator it = keys.begin();
        it != keys.end(); ++it)
      {
      cmState::CacheEntryType t = cm.GetState()->GetCacheEntryType(*it);
      if (t != cmState::INTERNAL && t != cmState::STATIC &&
          t != cmState::UNINITIALIZED)
        {
        const char* advancedProp =
            cm.GetState()->GetCacheEntryProperty(*it, "ADVANCED");
        if ( list_all_cached || !advancedProp)
          {
          if ( list_help )
            {
            std::cout << "// "
                      << cm.GetState()->GetCacheEntryProperty(*it,
                                                   "HELPSTRING") << std::endl;
            }
          std::cout << *it << ":" <<
            cmState::CacheEntryTypeToString(t)
            << "=" << cm.GetState()->GetCacheEntryValue(*it)
            << std::endl;
          if ( list_help )
            {
            std::cout << std::endl;
            }
          }
        }
      }
    }

  // Always return a non-negative value.  Windows tools do not always
  // interpret negative return values as errors.
  if(res != 0)
    {
    return 1;
    }
  else
    {
    return 0;
    }
}